

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::erase
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *pt,long *v)

{
  Node *n;
  bool bVar1;
  
  n = this->root;
  if (n == (Node *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    do {
      if ((((n->pt).field_0.x == (pt->field_0).x) && ((n->pt).field_1.y == (pt->field_1).y)) &&
         (n->value == *v)) {
        delete_node(this,n);
        return bVar1;
      }
      n = (&n->before)[(&(n->pt).field_0)[n->dim].x <= (&pt->field_0)[n->dim].x];
      bVar1 = n != (Node *)0x0;
    } while (bVar1);
  }
  return bVar1;
}

Assistant:

bool KDTree<CoordType, ValueType>::erase(
    const CoordType& pt, const ValueType& v) {
  if (this->root == nullptr) {
    return false;
  }

  for (Node* n = this->root; n != nullptr;) {
    if ((n->pt == pt) && (n->value == v)) {
      this->delete_node(n);
      return true;
    }
    n = (pt.at(n->dim) < n->pt.at(n->dim)) ? n->before : n->after_or_equal;
  }
  return false;
}